

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O3

void __thiscall cnn::LSTMBuilder::new_graph_impl(LSTMBuilder *this,ComputationGraph *cg)

{
  ulong uVar1;
  initializer_list<cnn::expr::Expression> __l;
  Expression i_bc;
  Expression i_h2c;
  Expression i_x2c;
  Expression i_bo;
  Expression i_c2o;
  Expression i_h2o;
  Expression i_x2o;
  Expression i_bi;
  Expression i_c2i;
  Expression i_h2i;
  Expression i_x2i;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  allocator_type local_1b1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  *local_1b0;
  undefined1 local_1a8 [24];
  undefined4 local_190;
  undefined1 local_188 [24];
  undefined4 local_170;
  undefined1 local_168 [24];
  undefined4 local_150;
  undefined1 local_148 [24];
  undefined4 local_130;
  undefined1 local_128 [24];
  undefined4 local_110;
  undefined1 local_108 [24];
  undefined4 local_f0;
  ExecutionEngine *local_e8;
  undefined4 local_e0;
  ExecutionEngine *local_d8;
  undefined4 local_d0;
  ExecutionEngine *local_c8;
  undefined4 local_c0;
  pointer local_b8;
  undefined4 local_b0;
  ExecutionEngine *local_a8;
  undefined4 local_a0;
  pointer local_98;
  undefined4 local_90;
  ExecutionEngine *local_88;
  undefined4 local_80;
  pointer local_78;
  undefined4 local_70;
  pointer local_68;
  undefined4 local_60;
  pointer local_58;
  undefined4 local_50;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_48;
  
  local_1b0 = &this->param_vars;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(local_1b0);
  if (this->layers != 0) {
    uVar1 = 0;
    do {
      expr::parameter((ComputationGraph *)local_108,(Parameters *)cg);
      expr::parameter((ComputationGraph *)(local_128 + 0x10),(Parameters *)cg);
      expr::parameter((ComputationGraph *)local_128,(Parameters *)cg);
      expr::parameter((ComputationGraph *)(local_148 + 0x10),(Parameters *)cg);
      expr::parameter((ComputationGraph *)local_148,(Parameters *)cg);
      expr::parameter((ComputationGraph *)(local_168 + 0x10),(Parameters *)cg);
      expr::parameter((ComputationGraph *)local_168,(Parameters *)cg);
      expr::parameter((ComputationGraph *)(local_188 + 0x10),(Parameters *)cg);
      expr::parameter((ComputationGraph *)local_188,(Parameters *)cg);
      expr::parameter((ComputationGraph *)(local_1a8 + 0x10),(Parameters *)cg);
      expr::parameter((ComputationGraph *)local_1a8,(Parameters *)cg);
      local_108._16_8_ = local_108._0_8_;
      local_f0 = local_108._8_4_;
      local_e8 = (ExecutionEngine *)local_128._16_8_;
      local_e0 = local_110;
      local_d8 = (ExecutionEngine *)local_128._0_8_;
      local_d0 = local_128._8_4_;
      local_c8 = (ExecutionEngine *)local_148._16_8_;
      local_c0 = local_130;
      local_b8 = (pointer)local_148._0_8_;
      local_b0 = local_148._8_4_;
      local_a8 = (ExecutionEngine *)local_168._16_8_;
      local_a0 = local_150;
      local_98 = (pointer)local_168._0_8_;
      local_90 = local_168._8_4_;
      local_88 = (ExecutionEngine *)local_188._16_8_;
      local_80 = local_170;
      local_78 = (pointer)local_188._0_8_;
      local_70 = local_188._8_4_;
      local_68 = (pointer)local_1a8._16_8_;
      local_60 = local_190;
      local_58 = (pointer)local_1a8._0_8_;
      local_50 = local_1a8._8_4_;
      __l._M_len = 0xb;
      __l._M_array = (iterator)(local_108 + 0x10);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                (&local_48,__l,&local_1b1);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::push_back(local_1b0,&local_48);
      if (local_48.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->layers);
  }
  return;
}

Assistant:

void LSTMBuilder::new_graph_impl(ComputationGraph& cg){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = parameter(cg,p[X2I]);
    Expression i_h2i = parameter(cg,p[H2I]);
    Expression i_c2i = parameter(cg,p[C2I]);
    Expression i_bi = parameter(cg,p[BI]);
    //o
    Expression i_x2o = parameter(cg,p[X2O]);
    Expression i_h2o = parameter(cg,p[H2O]);
    Expression i_c2o = parameter(cg,p[C2O]);
    Expression i_bo = parameter(cg,p[BO]);
    //c
    Expression i_x2c = parameter(cg,p[X2C]);
    Expression i_h2c = parameter(cg,p[H2C]);
    Expression i_bc = parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}